

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTRNG2IsAvail(void)

{
  long lVar1;
  bool_t bVar2;
  u32 info [4];
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 local_4;
  
  lVar1 = cpuid_basic_info(0);
  uVar3 = *(undefined4 *)(lVar1 + 4);
  bVar2 = rngCPUIDIsManufId((u32 *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
  if ((bVar2 == 0) &&
     (bVar2 = rngCPUIDIsManufId((u32 *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffd8), bVar2 == 0)) {
    local_4 = 0;
  }
  else {
    lVar1 = cpuid_Version_info(1);
    local_4 = (uint)((*(uint *)(lVar1 + 0xc) & 0x40000000) != 0);
  }
  return local_4;
}

Assistant:

static bool_t rngTRNG2IsAvail()
{
	u32 info[4];
	// Intel or AMD?
	rngCPUID(info, 0);
	if (!rngCPUIDIsManufId(info, "GenuineIntel") &&
		!rngCPUIDIsManufId(info, "AuthenticAMD"))
		return FALSE;
	// rdrand?
	rngCPUID(info, 1);
	return (info[2] & 0x40000000) != 0;
}